

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O0

void cppcms::impl::file_server::normalize_path(string *path)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  difference_type dVar4;
  reference pcVar5;
  string *in_RDI;
  iterator min_pos;
  iterator end;
  iterator start;
  iterator out;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff07;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_69;
  undefined8 local_68;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  string local_28 [32];
  string *local_8;
  
  local_8 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) ||
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_8), *pcVar3 != '/')) {
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::operator=(local_8,local_28);
    std::__cxx11::string::~string(local_28);
  }
  local_38 = std::__cxx11::string::begin();
  local_30 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(in_stack_ffffffffffffff08,
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,
                                           CONCAT24(in_stack_ffffffffffffff04,
                                                    in_stack_ffffffffffffff00))));
  local_48 = std::__cxx11::string::begin();
  local_40 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(in_stack_ffffffffffffff08,
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,
                                           CONCAT24(in_stack_ffffffffffffff04,
                                                    in_stack_ffffffffffffff00))));
  while( true ) {
    local_50 = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(in_stack_ffffffffffffff06,
                                            CONCAT24(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00))),
                       in_stack_fffffffffffffef8);
    if (!bVar1) break;
    local_60 = local_40._M_current;
    local_68 = std::__cxx11::string::end();
    local_69 = 0x2f;
    local_58 = (char *)std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                 (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                  (char *)in_stack_ffffffffffffff08);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(in_stack_ffffffffffffff06,
                                            CONCAT24(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00))),
                       in_stack_fffffffffffffef8);
    if ((!bVar1) &&
       ((dVar4 = __gnu_cxx::operator-
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff07,
                                        CONCAT16(in_stack_ffffffffffffff06,
                                                 CONCAT24(in_stack_ffffffffffffff04,
                                                          in_stack_ffffffffffffff00))),
                            in_stack_fffffffffffffef8), dVar4 != 1 ||
        (pcVar5 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_40), *pcVar5 != '.')))) {
      dVar4 = __gnu_cxx::operator-
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff07,
                                     CONCAT16(in_stack_ffffffffffffff06,
                                              CONCAT24(in_stack_ffffffffffffff04,
                                                       in_stack_ffffffffffffff00))),
                         in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff07 = false;
      if (dVar4 == 2) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_40);
        in_stack_ffffffffffffff07 = false;
        if (*pcVar5 == '.') {
          local_78 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_ffffffffffffff08,
                                 (ulong)CONCAT16(in_stack_ffffffffffffff06,
                                                 CONCAT24(in_stack_ffffffffffffff04,
                                                          in_stack_ffffffffffffff00)));
          pcVar5 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          in_stack_ffffffffffffff07 = *pcVar5 == '.';
        }
      }
      if ((bool)in_stack_ffffffffffffff07 == false) {
        local_30 = std::
                   copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                             (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                              in_stack_ffffffffffffff18);
        std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff07,
                                       CONCAT16(in_stack_ffffffffffffff06,
                                                CONCAT24(in_stack_ffffffffffffff04,
                                                         in_stack_ffffffffffffff00))),
                           in_stack_fffffffffffffef8);
        if (bVar1) {
          local_c8 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(in_stack_ffffffffffffff08,
                                  CONCAT13(in_stack_ffffffffffffff07,
                                           CONCAT12(in_stack_ffffffffffffff06,
                                                    in_stack_ffffffffffffff04)));
          pcVar5 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c8);
          *pcVar5 = '/';
        }
      }
      else {
        std::__cxx11::string::begin();
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+(in_stack_ffffffffffffff08,
                    CONCAT17(in_stack_ffffffffffffff07,
                             CONCAT16(in_stack_ffffffffffffff06,
                                      CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
                            ));
        bVar1 = __gnu_cxx::operator>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff07,
                                       CONCAT16(in_stack_ffffffffffffff06,
                                                CONCAT24(in_stack_ffffffffffffff04,
                                                         in_stack_ffffffffffffff00))),
                           in_stack_fffffffffffffef8);
        if (bVar1) {
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--(in_stack_ffffffffffffff08,
                       CONCAT13(in_stack_ffffffffffffff07,
                                CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)));
        }
        do {
          bVar1 = __gnu_cxx::operator>
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff07,
                                         CONCAT16(in_stack_ffffffffffffff06,
                                                  CONCAT24(in_stack_ffffffffffffff04,
                                                           in_stack_ffffffffffffff00))),
                             in_stack_fffffffffffffef8);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--(in_stack_ffffffffffffff08,
                       CONCAT13(in_stack_ffffffffffffff07,
                                CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)));
          pcVar5 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_30);
        } while (*pcVar5 != '/');
      }
    }
    std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(in_stack_ffffffffffffff06,
                                            CONCAT24(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00))),
                       in_stack_fffffffffffffef8);
    if (bVar1) break;
    local_40._M_current = local_58;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_40);
  }
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator-(in_stack_ffffffffffffff08,
              CONCAT17(in_stack_ffffffffffffff07,
                       CONCAT16(in_stack_ffffffffffffff06,
                                CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))));
  pcVar5 = __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xffffffffffffff28);
  uVar6 = false;
  if (*pcVar5 == '/') {
    std::__cxx11::string::begin();
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+(in_stack_ffffffffffffff08,
                CONCAT17(in_stack_ffffffffffffff07,
                         CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ))));
    uVar6 = __gnu_cxx::operator>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff04,
                                                           in_stack_ffffffffffffff00))),
                       in_stack_fffffffffffffef8);
  }
  if ((bool)uVar6 != false) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator--(in_stack_ffffffffffffff08,
                 CONCAT13(in_stack_ffffffffffffff07,CONCAT12(uVar6,in_stack_ffffffffffffff04)));
  }
  std::__cxx11::string::begin();
  __gnu_cxx::operator-
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff07,
                         CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ))),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_8);
  std::__cxx11::string::resize((ulong)local_8);
  return;
}

Assistant:

void file_server::normalize_path(std::string &path)
{
#ifdef CPPCMS_WIN32
	for(size_t i=0;i<path.size();i++)
		if(path[i]=='\\')
			path[i]='/';
#endif
	if(path.empty() || path[0]!='/')
		path = "/" + path;
	
	std::string::iterator out = path.begin() + 1;
	std::string::iterator start = path.begin() + 1;
	while(start < path.end()) {
		std::string::iterator end = std::find(start,path.end(),'/');
		if(end==start || (end-start == 1 && *start == '.')) { // case of "//" and "/./"
			// nothing to do
		}
		else if(end-start == 2 && *start == '.' && *(start+1) == '.') {
			std::string::iterator min_pos = path.begin() + 1;
			if(out > min_pos)
				out --;
			while(out > min_pos) {
				out --;
				if(*out == '/')
					break;
			}
		}
		else {
			out = std::copy(start,end,out);
			if(end != path.end())
				*out++ = '/';
		}
		if(end == path.end())
			break;
		start = end;
		++start;
	}
	if(*(out-1) == '/' && out > path.begin()+1)
		out--;
	path.resize(out - path.begin());
}